

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventdispatcher_glib.cpp
# Opt level: O2

void __thiscall QEventDispatcherGlib::~QEventDispatcherGlib(QEventDispatcherGlib *this)

{
  QArrayDataPointer<GPollFDWithQSocketNotifier_*> *this_00;
  long lVar1;
  GPollFDWithQSocketNotifier *pGVar2;
  pointer ppGVar3;
  int i;
  ulong uVar4;
  
  *(undefined ***)this = &PTR_metaObject_0066d7f8;
  lVar1 = *(long *)(this + 8);
  QTimerInfoList::clearTimers((QTimerInfoList *)(*(long *)(lVar1 + 0xb0) + 0x60));
  QArrayDataPointer<QTimerInfo_*>::~QArrayDataPointer
            ((QArrayDataPointer<QTimerInfo_*> *)(*(long *)(lVar1 + 0xb0) + 0x70));
  g_source_destroy(*(undefined8 *)(lVar1 + 0xb0));
  g_source_unref(*(undefined8 *)(lVar1 + 0xb0));
  *(undefined8 *)(lVar1 + 0xb0) = 0;
  g_source_destroy(*(undefined8 *)(lVar1 + 0xb8));
  g_source_unref(*(undefined8 *)(lVar1 + 0xb8));
  *(undefined8 *)(lVar1 + 0xb8) = 0;
  for (uVar4 = 0;
      this_00 = (QArrayDataPointer<GPollFDWithQSocketNotifier_*> *)(*(long *)(lVar1 + 0xa8) + 0x60),
      uVar4 < *(ulong *)(*(long *)(lVar1 + 0xa8) + 0x70); uVar4 = uVar4 + 1) {
    ppGVar3 = QList<GPollFDWithQSocketNotifier_*>::data
                        ((QList<GPollFDWithQSocketNotifier_*> *)this_00);
    pGVar2 = ppGVar3[uVar4];
    g_source_remove_poll(*(undefined8 *)(lVar1 + 0xa8),pGVar2);
    operator_delete(pGVar2,0x10);
  }
  QArrayDataPointer<GPollFDWithQSocketNotifier_*>::~QArrayDataPointer(this_00);
  g_source_destroy(*(undefined8 *)(lVar1 + 0xa8));
  g_source_unref(*(undefined8 *)(lVar1 + 0xa8));
  *(undefined8 *)(lVar1 + 0xa8) = 0;
  g_source_destroy(*(undefined8 *)(lVar1 + 0xa0));
  g_source_unref(*(undefined8 *)(lVar1 + 0xa0));
  *(undefined8 *)(lVar1 + 0xa0) = 0;
  g_main_context_pop_thread_default(*(undefined8 *)(lVar1 + 0x98));
  g_main_context_unref(*(undefined8 *)(lVar1 + 0x98));
  *(undefined8 *)(lVar1 + 0x98) = 0;
  QAbstractEventDispatcherV2::~QAbstractEventDispatcherV2((QAbstractEventDispatcherV2 *)this);
  return;
}

Assistant:

QEventDispatcherGlib::~QEventDispatcherGlib()
{
    Q_D(QEventDispatcherGlib);

    // destroy all timer sources
    d->timerSource->timerList.clearTimers();
    d->timerSource->timerList.~QTimerInfoList();
    g_source_destroy(&d->timerSource->source);
    g_source_unref(&d->timerSource->source);
    d->timerSource = nullptr;
    g_source_destroy(&d->idleTimerSource->source);
    g_source_unref(&d->idleTimerSource->source);
    d->idleTimerSource = nullptr;

    // destroy socket notifier source
    for (int i = 0; i < d->socketNotifierSource->pollfds.size(); ++i) {
        GPollFDWithQSocketNotifier *p = d->socketNotifierSource->pollfds[i];
        g_source_remove_poll(&d->socketNotifierSource->source, &p->pollfd);
        delete p;
    }
    d->socketNotifierSource->pollfds.~QList<GPollFDWithQSocketNotifier *>();
    g_source_destroy(&d->socketNotifierSource->source);
    g_source_unref(&d->socketNotifierSource->source);
    d->socketNotifierSource = nullptr;

    // destroy post event source
    g_source_destroy(&d->postEventSource->source);
    g_source_unref(&d->postEventSource->source);
    d->postEventSource = nullptr;

    Q_ASSERT(d->mainContext != nullptr);
#if GLIB_CHECK_VERSION (2, 22, 0)
    g_main_context_pop_thread_default (d->mainContext);
#endif
    g_main_context_unref(d->mainContext);
    d->mainContext = nullptr;
}